

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

string * __thiscall
spectest::JSONParser::CreateModulePath_abi_cxx11_
          (string *__return_storage_ptr__,JSONParser *this,string_view filename)

{
  ulong n;
  size_type sVar1;
  string_view filename_local;
  string_view dirname;
  string local_40;
  
  filename_local.size_ = filename.size_;
  filename_local.data_ = filename.data_;
  local_40._M_dataplus._M_p = (this->loc_).filename.data_;
  local_40._M_string_length = (this->loc_).filename.size_;
  n = wabt::string_view::find_last_of((string_view *)&local_40,'/',0xffffffffffffffff);
  sVar1 = wabt::string_view::find_last_of((string_view *)&local_40,'\\',0xffffffffffffffff);
  if (n == 0xffffffffffffffff) {
    n = 0;
  }
  if (sVar1 == 0xffffffffffffffff) {
    sVar1 = 0;
  }
  if (n <= sVar1) {
    n = sVar1;
  }
  dirname = wabt::string_view::substr((string_view *)&local_40,0,n);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (dirname.size_ == 0) {
    wabt::string_view::to_string_abi_cxx11_(&local_40,&filename_local);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
  }
  else {
    wabt::string_view::to_string_abi_cxx11_(&local_40,&dirname);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    wabt::string_view::to_string_abi_cxx11_(&local_40,&filename_local);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::_M_dispose();
  wabt::ConvertBackslashToSlash(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string JSONParser::CreateModulePath(string_view filename) {
  string_view spec_json_filename = loc_.filename;
  string_view dirname = GetDirname(spec_json_filename);
  std::string path;

  if (dirname.size() == 0) {
    path = filename.to_string();
  } else {
    path = dirname.to_string();
    path += '/';
    path += filename.to_string();
  }

  ConvertBackslashToSlash(&path);
  return path;
}